

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O1

VertexAlignment *
s2polyline_alignment::GetExactVertexAlignment
          (VertexAlignment *__return_storage_ptr__,S2Polyline *a,S2Polyline *b)

{
  Window w;
  allocator_type local_59;
  Window local_58;
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  local_38;
  value_type local_20;
  
  if ((long)a->num_vertices_ < 1) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x11b,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               local_58.strides_.
               super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               ._M_impl.super__Vector_impl_data._M_start,"Check failed: a_n > 0 ",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               local_58.strides_.
               super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               ._M_impl.super__Vector_impl_data._M_start,"A is empty polyline.",0x14);
  }
  else {
    local_20.end = b->num_vertices_;
    if (0 < local_20.end) {
      local_20.start = 0;
      std::
      vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
      ::vector(&local_38,(long)a->num_vertices_,&local_20,&local_59);
      Window::Window(&local_58,&local_38);
      if (local_38.
          super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.
                        super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      DynamicTimewarp(__return_storage_ptr__,a,b,&local_58);
      if (local_58.strides_.
          super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.strides_.
                        super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x11c,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               local_58.strides_.
               super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               ._M_impl.super__Vector_impl_data._M_start,"Check failed: b_n > 0 ",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               local_58.strides_.
               super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               ._M_impl.super__Vector_impl_data._M_start,"B is empty polyline.",0x14);
  }
  abort();
}

Assistant:

VertexAlignment GetExactVertexAlignment(const S2Polyline& a,
                                        const S2Polyline& b) {
  const int a_n = a.num_vertices();
  const int b_n = b.num_vertices();
  S2_CHECK(a_n > 0) << "A is empty polyline.";
  S2_CHECK(b_n > 0) << "B is empty polyline.";
  const auto w = Window(std::vector<ColumnStride>(a_n, {0, b_n}));
  return DynamicTimewarp(a, b, w);
}